

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void ARGBAffineRow_C(uint8_t *src_argb,int src_argb_stride,uint8_t *dst_argb,float *uv_dudv,
                    int width)

{
  int y;
  int x;
  float uv [2];
  int i;
  int width_local;
  float *uv_dudv_local;
  uint8_t *dst_argb_local;
  int src_argb_stride_local;
  uint8_t *src_argb_local;
  
  uv[0] = *uv_dudv;
  uv[1] = uv_dudv[1];
  dst_argb_local = dst_argb;
  for (i = 0; i < width; i = i + 1) {
    *(undefined4 *)dst_argb_local =
         *(undefined4 *)(src_argb + (long)((int)uv[0] << 2) + (long)((int)uv[1] * src_argb_stride));
    dst_argb_local = dst_argb_local + 4;
    uv[0] = uv_dudv[2] + uv[0];
    uv[1] = uv_dudv[3] + uv[1];
  }
  return;
}

Assistant:

LIBYUV_API
void ARGBAffineRow_C(const uint8_t* src_argb,
                     int src_argb_stride,
                     uint8_t* dst_argb,
                     const float* uv_dudv,
                     int width) {
  int i;
  // Render a row of pixels from source into a buffer.
  float uv[2];
  uv[0] = uv_dudv[0];
  uv[1] = uv_dudv[1];
  for (i = 0; i < width; ++i) {
    int x = (int)(uv[0]);
    int y = (int)(uv[1]);
    *(uint32_t*)(dst_argb) =
        *(const uint32_t*)(src_argb + y * src_argb_stride + x * 4);
    dst_argb += 4;
    uv[0] += uv_dudv[2];
    uv[1] += uv_dudv[3];
  }
}